

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O1

uint32_t __thiscall
cfd::Psbt::AddTxOutData(Psbt *this,Amount *amount,Address *address,KeyData *key_data)

{
  uint32_t index;
  Script SStack_68;
  
  core::Address::GetLockingScript(&SStack_68,address);
  index = core::Psbt::AddTxOut(&this->super_Psbt,&SStack_68,amount);
  core::Script::~Script(&SStack_68);
  core::Psbt::SetTxOutData(&this->super_Psbt,index,key_data);
  return index;
}

Assistant:

uint32_t Psbt::AddTxOutData(
    const Amount& amount, const Address& address, const KeyData& key_data) {
  uint32_t index =
      cfd::core::Psbt::AddTxOut(address.GetLockingScript(), amount);
  try {
    SetTxOutData(index, key_data);
  } catch (const CfdException& except) {
    struct wally_psbt* psbt_pointer;
    psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
    wally_psbt_remove_output(psbt_pointer, index);
    base_tx_ = cfd::core::Psbt::RebuildTransaction(wally_psbt_pointer_);
    throw except;
  }
  return index;
}